

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

result<toml::detail::none_t,_toml::error_info> *
toml::detail::parse_table<toml::type_config>
          (result<toml::detail::none_t,_toml::error_info> *__return_storage_ptr__,location *loc,
          context<toml::type_config> *ctx,basic_value<toml::type_config> *table)

{
  vector<toml::error_info,_std::allocator<toml::error_info>_> *this;
  element_type *peVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Alloc_hider _Var3;
  void *pvVar4;
  long lVar5;
  undefined1 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  char cVar9;
  table_format_info *ptVar10;
  value_type *pvVar11;
  error_type *peVar12;
  value_type *pvVar13;
  error_type *peVar14;
  table_type *current_table_ptr;
  error_type *peVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  int iVar17;
  undefined **__args;
  error_info *__args_00;
  undefined1 uVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *com;
  value_type *__x;
  bool newline_found;
  initializer_list<unsigned_char> cs;
  value_type com_opt;
  optional<toml::detail::multiline_spacer<toml::type_config>_> sp;
  result<toml::basic_value<toml::type_config>_*,_toml::error_info> ins_res;
  type val;
  location start;
  result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
  kv_res;
  undefined1 local_7b0 [48];
  undefined1 local_780 [40];
  string local_758;
  string local_738;
  comment_type *local_718;
  ulong local_710;
  size_t *local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_700;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_6f8;
  _func_int **local_6f0;
  _func_int **local_6e8;
  error_info local_6e0;
  error_info local_688;
  error_info local_630;
  undefined1 local_5d8 [16];
  _Alloc_hider local_5c8;
  pointer local_5c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5b8;
  size_t local_5a8;
  size_t sStack_5a0;
  size_t local_598;
  size_t sStack_590;
  size_t local_588;
  size_t sStack_580;
  size_t local_578;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_568;
  undefined1 local_548 [96];
  undefined1 local_4e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d8;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4c8;
  undefined8 local_4b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a0 [6];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_438;
  location local_420;
  region local_3d8;
  undefined1 local_370 [8];
  undefined1 local_368 [24];
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_350;
  undefined8 local_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328 [16];
  source_location local_220;
  basic_value<toml::type_config> local_1a8;
  failure<toml::error_info> local_e0;
  failure<toml::error_info> local_88;
  
  this = &ctx->errors_;
  local_710 = (long)(ctx->errors_).
                    super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(ctx->errors_).
                    super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
                    super__Vector_impl_data._M_start;
  ptVar10 = basic_value<toml::type_config>::as_table_fmt(table);
  ptVar10->indent_type = none;
  local_708 = &loc->location_;
  local_6f8 = &(loc->source_).
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount;
  local_700 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &loc->source_name_;
  local_718 = &local_1a8.comments_;
  local_6e8 = (_func_int **)&PTR__repeat_at_least_00569a90;
  local_6f0 = (_func_int **)&PTR__scanner_base_00569818;
  local_7b0._40_8_ = &__return_storage_ptr__->field_1;
  newline_found = true;
  do {
    peVar1 = (loc->source_).
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if ((ulong)((long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start) <= loc->location_) goto LAB_003b2255;
    location::location(&local_420,loc);
    skip_multiline_spacer<toml::type_config>
              ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)local_780,loc,ctx,
               newline_found);
    peVar1 = (loc->source_).
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    iVar17 = 3;
    if (loc->location_ <
        (ulong)((long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start)) {
      local_7b0._0_2_ = 0x920;
      cs._M_len = 2;
      cs._M_array = local_7b0;
      character_either::character_either((character_either *)local_4e8,cs);
      local_548._0_8_ = local_6e8;
      local_548._8_8_ = (pointer)0x0;
      scanner_storage::scanner_storage<toml::detail::character_either,_nullptr>
                ((scanner_storage *)(local_548 + 0x10),(character_either *)local_4e8);
      pvVar4 = (void *)CONCAT71(local_4e8._9_7_,local_4e8[8]);
      if (pvVar4 != (void *)0x0) {
        operator_delete(pvVar4,local_4d8._8_8_ - (long)pvVar4);
      }
      local_4e8._0_8_ = local_6f0;
      local_4e8[8] = '[';
      sequence::sequence<toml::detail::repeat_at_least,toml::detail::character>
                ((sequence *)local_5d8,(repeat_at_least *)local_548,(character *)local_4e8);
      sequence::scan((region *)local_370,(sequence *)local_5d8,loc);
      lVar5 = CONCAT71(local_370._1_7_,local_370[0]);
      region::~region((region *)local_370);
      std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
      ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
               *)(local_5d8 + 8));
      if ((scanner_base *)local_548._16_8_ != (scanner_base *)0x0) {
        (*(*(_func_int ***)local_548._16_8_)[1])();
      }
      uVar6 = local_780[1];
      if (lVar5 == 0) {
        uVar18 = '\x01';
        if ((newline_found == false) && (uVar18 = local_780[0], (bool)local_780[0x20] != true)) {
          uVar18 = '\0';
        }
        if (uVar18 == '\0') {
          local_758._M_dataplus._M_p = (pointer)&local_758.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_758,
                     "toml::parse_table: newline (LF / CRLF) or EOF is expected","");
          region::region((region *)local_370,loc);
          source_location::source_location(&local_220,(region *)local_370);
          local_738._M_dataplus._M_p = (pointer)&local_738.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_738,"here","");
          make_error_info<>((error_info *)local_4e8,&local_758,&local_220,&local_738);
          err<toml::error_info>(&local_88,(error_info *)local_4e8);
          __return_storage_ptr__->is_ok_ = false;
          failure<toml::error_info>::failure
                    ((failure<toml::error_info> *)local_7b0._40_8_,&local_88);
          failure<toml::error_info>::~failure(&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4b0 != local_4a0) {
            operator_delete((void *)local_4b0,local_4a0[0]._M_allocated_capacity + 1);
          }
          std::
          vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector(&local_4c8);
          if ((undefined1 *)local_4e8._0_8_ != local_4e8 + 0x10) {
            operator_delete((void *)local_4e8._0_8_,(ulong)(local_4d8._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_738._M_dataplus._M_p != &local_738.field_2) {
            operator_delete(local_738._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
          }
          source_location::~source_location(&local_220);
          region::~region((region *)local_370);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_758._M_dataplus._M_p != &local_758.field_2) {
            operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
          }
          iVar17 = 1;
          newline_found = false;
        }
        else {
          if (((bool)local_780[0x20] == true) && (local_780[1] != none)) {
            ptVar10 = basic_value<toml::type_config>::as_table_fmt(table);
            uVar7 = local_780._4_4_;
            ptVar10->indent_type = uVar6;
            if ((bool)local_780[0x20] == false) {
              std::__throw_bad_optional_access();
            }
            ptVar10 = basic_value<toml::type_config>::as_table_fmt(table);
            ptVar10->body_indent = uVar7;
          }
          parse_key_value_pair<toml::type_config>
                    ((result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
                      *)local_370,loc,ctx);
          if (local_370[0] == true) {
            pvVar11 = result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
                      ::unwrap((result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
                                *)local_370,(source_location)0x569d98);
            local_568.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pvVar11->first).first.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_568.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (pvVar11->first).first.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_568.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pvVar11->first).first.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            (pvVar11->first).first.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pvVar11->first).first.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pvVar11->first).first.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pvVar11 = result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
                      ::unwrap((result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
                                *)local_370,(source_location)0x569db0);
            local_5d8._0_8_ =
                 (pvVar11->first).second.source_.
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
            local_5d8._8_8_ =
                 (pvVar11->first).second.source_.
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
            (pvVar11->first).second.source_.
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            (pvVar11->first).second.source_.
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)0x0;
            local_5c8._M_p = (pointer)&local_5b8;
            paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(pvVar11->first).second.source_name_._M_dataplus._M_p;
            paVar16 = &(pvVar11->first).second.source_name_.field_2;
            if (paVar2 == paVar16) {
              local_5b8._M_allocated_capacity = paVar16->_M_allocated_capacity;
              local_5b8._8_8_ =
                   *(undefined8 *)((long)&(pvVar11->first).second.source_name_.field_2 + 8);
            }
            else {
              local_5b8._M_allocated_capacity = paVar16->_M_allocated_capacity;
              local_5c8._M_p = (pointer)paVar2;
            }
            local_5c0 = (pointer)(pvVar11->first).second.source_name_._M_string_length;
            (pvVar11->first).second.source_name_._M_dataplus._M_p = (pointer)paVar16;
            (pvVar11->first).second.source_name_._M_string_length = 0;
            (pvVar11->first).second.source_name_.field_2._M_local_buf[0] = '\0';
            local_578 = (pvVar11->first).second.last_column_;
            local_5a8 = (pvVar11->first).second.length_;
            sStack_5a0 = (pvVar11->first).second.first_;
            local_598 = (pvVar11->first).second.first_line_;
            sStack_590 = (pvVar11->first).second.first_column_;
            local_588 = (pvVar11->first).second.last_;
            sStack_580 = (pvVar11->first).second.last_line_;
            pvVar11 = result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
                      ::unwrap((result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
                                *)local_370,(source_location)0x569dc8);
            basic_value<toml::type_config>::basic_value
                      ((basic_value<toml::type_config> *)local_4e8,&pvVar11->second);
            uVar8 = local_780._16_8_;
            __x = (value_type *)local_780._8_8_;
            if ((bool)local_780[0x20] == true) {
              for (; __x != (value_type *)uVar8; __x = __x + 1) {
                CLI::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&vStack_438,__x);
              }
            }
            parse_comment_line<toml::type_config>
                      ((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                        *)local_548,loc,ctx);
            if (local_548[0] == true) {
              __args = &PTR_s__workspace_llm4binary_github_lic_00569de0;
              pvVar13 = result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                        ::unwrap((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                                  *)local_548,(source_location)0x569de0);
              local_7b0[0x20] = 0;
              newline_found =
                   (pvVar13->
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   )._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_engaged == true;
              cVar9 = newline_found;
              if (newline_found) {
                local_7b0._0_8_ = local_7b0 + 0x10;
                _Var3._M_p = (pvVar13->
                             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                             )._M_payload.
                             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ._M_payload._M_value._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_7b0,_Var3._M_p,
                           _Var3._M_p +
                           (pvVar13->
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           )._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._M_payload._M_value._M_string_length);
                __args = (undefined **)local_7b0;
                local_7b0[0x20] = newline_found;
                CLI::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&vStack_438,(value_type *)__args);
                cVar9 = local_7b0[0x20];
              }
              local_7b0[0x20] = cVar9;
              if ((local_7b0[0x20] == '\x01') &&
                 (local_7b0[0x20] = '\0', (undefined1 *)local_7b0._0_8_ != local_7b0 + 0x10)) {
                __args = (undefined **)(local_7b0._16_8_ + 1);
                operator_delete((void *)local_7b0._0_8_,(ulong)__args);
              }
            }
            else {
              peVar14 = result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                        ::unwrap_err((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                                      *)local_548,(source_location)0x569df8);
              local_630.title_._M_dataplus._M_p = (pointer)&local_630.title_.field_2;
              paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(peVar14->title_)._M_dataplus._M_p;
              paVar2 = &(peVar14->title_).field_2;
              if (paVar16 == paVar2) {
                local_630.title_.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
                local_630.title_.field_2._8_8_ =
                     *(undefined8 *)((long)&(peVar14->title_).field_2 + 8);
              }
              else {
                local_630.title_.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
                local_630.title_._M_dataplus._M_p = (pointer)paVar16;
              }
              local_630.title_._M_string_length = (peVar14->title_)._M_string_length;
              (peVar14->title_)._M_dataplus._M_p = (pointer)paVar2;
              (peVar14->title_)._M_string_length = 0;
              (peVar14->title_).field_2._M_local_buf[0] = '\0';
              local_630.locations_.
              super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (peVar14->locations_).
                   super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_630.locations_.
              super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   (peVar14->locations_).
                   super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_630.locations_.
              super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (peVar14->locations_).
                   super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              (peVar14->locations_).
              super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              (peVar14->locations_).
              super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              (peVar14->locations_).
              super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_630.suffix_._M_dataplus._M_p = (pointer)&local_630.suffix_.field_2;
              paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(peVar14->suffix_)._M_dataplus._M_p;
              paVar16 = &(peVar14->suffix_).field_2;
              if (paVar2 == paVar16) {
                local_630.suffix_.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
                local_630.suffix_.field_2._8_8_ =
                     *(undefined8 *)((long)&(peVar14->suffix_).field_2 + 8);
              }
              else {
                local_630.suffix_.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
                local_630.suffix_._M_dataplus._M_p = (pointer)paVar2;
              }
              local_630.suffix_._M_string_length = (peVar14->suffix_)._M_string_length;
              (peVar14->suffix_)._M_dataplus._M_p = (pointer)paVar16;
              (peVar14->suffix_)._M_string_length = 0;
              (peVar14->suffix_).field_2._M_local_buf[0] = '\0';
              __args = (undefined **)&local_630;
              std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
              emplace_back<toml::error_info>(this,(error_info *)__args);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_630.suffix_._M_dataplus._M_p != &local_630.suffix_.field_2) {
                __args = (undefined **)(local_630.suffix_.field_2._M_allocated_capacity + 1);
                operator_delete(local_630.suffix_._M_dataplus._M_p,(ulong)__args);
              }
              std::
              vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~vector(&local_630.locations_);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_630.title_._M_dataplus._M_p != &local_630.title_.field_2) {
                __args = (undefined **)(local_630.title_.field_2._M_allocated_capacity + 1);
                operator_delete(local_630.title_._M_dataplus._M_p,(ulong)__args);
              }
              newline_found = false;
            }
            result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
            ::cleanup((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                       *)local_548,(EVP_PKEY_CTX *)__args);
            current_table_ptr = basic_value<toml::type_config>::as_table_abi_cxx11_(table);
            local_3d8.source_.
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)local_5d8._0_8_;
            local_3d8.source_.
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5d8._8_8_;
            local_5d8._0_8_ = (_func_int **)0x0;
            local_5d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_3d8.source_name_._M_dataplus._M_p = (pointer)&local_3d8.source_name_.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5c8._M_p == &local_5b8) {
              local_3d8.source_name_.field_2._8_8_ = local_5b8._8_8_;
            }
            else {
              local_3d8.source_name_._M_dataplus._M_p = local_5c8._M_p;
            }
            local_3d8.source_name_.field_2._M_allocated_capacity = local_5b8._M_allocated_capacity;
            local_3d8.source_name_._M_string_length = (size_type)local_5c0;
            local_5c0 = (pointer)0x0;
            local_5b8._M_allocated_capacity = local_5b8._M_allocated_capacity & 0xffffffffffffff00;
            local_3d8.last_column_ = local_578;
            local_3d8.last_ = local_588;
            local_3d8.last_line_ = sStack_580;
            local_3d8.first_line_ = local_598;
            local_3d8.first_column_ = sStack_590;
            local_3d8.length_ = local_5a8;
            local_3d8.first_ = sStack_5a0;
            local_5c8._M_p = (pointer)&local_5b8;
            basic_value<toml::type_config>::basic_value
                      (&local_1a8,(basic_value<toml::type_config> *)local_4e8);
            __args_00 = (error_info *)0x2;
            insert_value<toml::type_config>
                      ((result<toml::basic_value<toml::type_config>_*,_toml::error_info> *)local_548
                       ,dotted_keys,current_table_ptr,&local_568,&local_3d8,&local_1a8);
            basic_value<toml::type_config>::cleanup(&local_1a8,(EVP_PKEY_CTX *)__args_00);
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_718);
            region::~region(&local_1a8.region_);
            region::~region(&local_3d8);
            if (local_548[0] == false) {
              peVar15 = result<toml::basic_value<toml::type_config>_*,_toml::error_info>::unwrap_err
                                  ((result<toml::basic_value<toml::type_config>_*,_toml::error_info>
                                    *)local_548,(source_location)0x569e10);
              local_688.title_._M_dataplus._M_p = (pointer)&local_688.title_.field_2;
              paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(peVar15->title_)._M_dataplus._M_p;
              paVar2 = &(peVar15->title_).field_2;
              if (paVar16 == paVar2) {
                local_688.title_.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
                local_688.title_.field_2._8_8_ =
                     *(undefined8 *)((long)&(peVar15->title_).field_2 + 8);
              }
              else {
                local_688.title_.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
                local_688.title_._M_dataplus._M_p = (pointer)paVar16;
              }
              local_688.title_._M_string_length = (peVar15->title_)._M_string_length;
              (peVar15->title_)._M_dataplus._M_p = (pointer)paVar2;
              (peVar15->title_)._M_string_length = 0;
              (peVar15->title_).field_2._M_local_buf[0] = '\0';
              local_688.locations_.
              super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (peVar15->locations_).
                   super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_688.locations_.
              super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   (peVar15->locations_).
                   super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_688.locations_.
              super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (peVar15->locations_).
                   super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              (peVar15->locations_).
              super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              (peVar15->locations_).
              super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              (peVar15->locations_).
              super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_688.suffix_._M_dataplus._M_p = (pointer)&local_688.suffix_.field_2;
              paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(peVar15->suffix_)._M_dataplus._M_p;
              paVar16 = &(peVar15->suffix_).field_2;
              if (paVar2 == paVar16) {
                local_688.suffix_.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
                local_688.suffix_.field_2._8_8_ =
                     *(undefined8 *)((long)&(peVar15->suffix_).field_2 + 8);
              }
              else {
                local_688.suffix_.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
                local_688.suffix_._M_dataplus._M_p = (pointer)paVar2;
              }
              local_688.suffix_._M_string_length = (peVar15->suffix_)._M_string_length;
              (peVar15->suffix_)._M_dataplus._M_p = (pointer)paVar16;
              (peVar15->suffix_)._M_string_length = 0;
              (peVar15->suffix_).field_2._M_local_buf[0] = '\0';
              __args_00 = &local_688;
              std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
              emplace_back<toml::error_info>(this,__args_00);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_688.suffix_._M_dataplus._M_p != &local_688.suffix_.field_2) {
                __args_00 = (error_info *)(local_688.suffix_.field_2._M_allocated_capacity + 1);
                operator_delete(local_688.suffix_._M_dataplus._M_p,(ulong)__args_00);
              }
              std::
              vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~vector(&local_688.locations_);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_688.title_._M_dataplus._M_p != &local_688.title_.field_2) {
                __args_00 = (error_info *)(local_688.title_.field_2._M_allocated_capacity + 1);
                operator_delete(local_688.title_._M_dataplus._M_p,(ulong)__args_00);
              }
            }
            if (local_548[0] == false) {
              failure<toml::error_info>::~failure((failure<toml::error_info> *)(local_548 + 8));
            }
            basic_value<toml::type_config>::cleanup
                      ((basic_value<toml::type_config> *)local_4e8,(EVP_PKEY_CTX *)__args_00);
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&vStack_438);
            region::~region((region *)local_4a0);
            region::~region((region *)local_5d8);
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_568);
          }
          else {
            peVar12 = result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
                      ::unwrap_err((result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
                                    *)local_370,(source_location)0x569e28);
            local_6e0.title_._M_dataplus._M_p = (pointer)&local_6e0.title_.field_2;
            paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(peVar12->title_)._M_dataplus._M_p;
            paVar2 = &(peVar12->title_).field_2;
            if (paVar16 == paVar2) {
              local_6e0.title_.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
              local_6e0.title_.field_2._8_8_ = *(undefined8 *)((long)&(peVar12->title_).field_2 + 8)
              ;
            }
            else {
              local_6e0.title_.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
              local_6e0.title_._M_dataplus._M_p = (pointer)paVar16;
            }
            local_6e0.title_._M_string_length = (peVar12->title_)._M_string_length;
            (peVar12->title_)._M_dataplus._M_p = (pointer)paVar2;
            (peVar12->title_)._M_string_length = 0;
            (peVar12->title_).field_2._M_local_buf[0] = '\0';
            local_6e0.locations_.
            super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (peVar12->locations_).
                 super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_6e0.locations_.
            super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (peVar12->locations_).
                 super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_6e0.locations_.
            super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (peVar12->locations_).
                 super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            (peVar12->locations_).
            super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (peVar12->locations_).
            super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (peVar12->locations_).
            super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_6e0.suffix_._M_dataplus._M_p = (pointer)&local_6e0.suffix_.field_2;
            paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(peVar12->suffix_)._M_dataplus._M_p;
            paVar16 = &(peVar12->suffix_).field_2;
            if (paVar2 == paVar16) {
              local_6e0.suffix_.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
              local_6e0.suffix_.field_2._8_8_ =
                   *(undefined8 *)((long)&(peVar12->suffix_).field_2 + 8);
            }
            else {
              local_6e0.suffix_.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
              local_6e0.suffix_._M_dataplus._M_p = (pointer)paVar2;
            }
            local_6e0.suffix_._M_string_length = (peVar12->suffix_)._M_string_length;
            (peVar12->suffix_)._M_dataplus._M_p = (pointer)paVar16;
            (peVar12->suffix_)._M_string_length = 0;
            (peVar12->suffix_).field_2._M_local_buf[0] = '\0';
            std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
            emplace_back<toml::error_info>(this,&local_6e0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_6e0.suffix_._M_dataplus._M_p != &local_6e0.suffix_.field_2) {
              operator_delete(local_6e0.suffix_._M_dataplus._M_p,
                              local_6e0.suffix_.field_2._M_allocated_capacity + 1);
            }
            std::
            vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~vector(&local_6e0.locations_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_6e0.title_._M_dataplus._M_p != &local_6e0.title_.field_2) {
              operator_delete(local_6e0.title_._M_dataplus._M_p,
                              local_6e0.title_.field_2._M_allocated_capacity + 1);
            }
            skip_key_value_pair<toml::type_config>(loc,ctx);
            newline_found = false;
          }
          if (local_370[0] == true) {
            success<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>_>
            ::~success((success<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>_>
                        *)local_368);
          }
          else {
            failure<toml::error_info>::~failure((failure<toml::error_info> *)local_368);
          }
          iVar17 = 0;
        }
      }
      else {
        (loc->source_).
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = local_420.source_.
                  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_6f8,
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_420.source_.
                    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign(local_700,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &local_420.source_name_);
        local_708[2] = local_420.column_number_;
        *local_708 = local_420.location_;
        local_708[1] = local_420.line_number_;
        iVar17 = 3;
      }
    }
    if ((bool)local_780[0x20] == true) {
      local_780[0x20] = false;
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_780 + 8));
    }
    location::~location(&local_420);
  } while (iVar17 == 0);
  if (iVar17 == 3) {
LAB_003b2255:
    if (local_710 <
        (ulong)((long)(ctx->errors_).
                      super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(ctx->errors_).
                     super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl
                     .super__Vector_impl_data._M_start)) {
      context<toml::type_config>::pop_last_error((error_info *)local_370,ctx);
      err<toml::error_info>(&local_e0,(error_info *)local_370);
      __return_storage_ptr__->is_ok_ = false;
      failure<toml::error_info>::failure((failure<toml::error_info> *)local_7b0._40_8_,&local_e0);
      failure<toml::error_info>::~failure(&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338 != local_328) {
        operator_delete((void *)local_338,local_328[0]._0_8_ + 1);
      }
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_350);
      if ((undefined1 *)CONCAT71(local_370._1_7_,local_370[0]) != local_368 + 8) {
        operator_delete((undefined1 *)CONCAT71(local_370._1_7_,local_370[0]),
                        (ulong)(local_368._8_8_ + 1));
      }
    }
    else {
      __return_storage_ptr__->is_ok_ = true;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

result<none_t, error_info>
parse_table(location& loc, context<TC>& ctx, basic_value<TC>& table)
{
    assert(table.is_table());

    const auto num_errors = ctx.errors().size();
    const auto& spec = ctx.toml_spec();

    // clear indent info
    table.as_table_fmt().indent_type = indent_char::none;

    bool newline_found = true;
    while( ! loc.eof())
    {
        const auto start = loc;

        auto sp = skip_multiline_spacer(loc, ctx, newline_found);

        // if reached to EOF, the table ends here. return.
        if(loc.eof())
        {
            break;
        }
        // if next table is comming, return.
        if(sequence(syntax::ws(spec), character('[')).scan(loc).is_ok())
        {
            loc = start;
            break;
        }
        // otherwise, it should be a key-value pair.
        newline_found = newline_found || (sp.has_value() && sp.value().newline_found);
        if( ! newline_found)
        {
            return err(make_error_info("toml::parse_table: "
                "newline (LF / CRLF) or EOF is expected",
                source_location(region(loc)), "here"));
        }
        if(sp.has_value() && sp.value().indent_type != indent_char::none)
        {
            table.as_table_fmt().indent_type = sp.value().indent_type;
            table.as_table_fmt().body_indent = sp.value().indent;
        }

        newline_found = false; // reset
        if(auto kv_res = parse_key_value_pair(loc, ctx))
        {
            auto keys    = std::move(kv_res.unwrap().first.first);
            auto key_reg = std::move(kv_res.unwrap().first.second);
            auto val     = std::move(kv_res.unwrap().second);

            if(sp.has_value())
            {
                for(const auto& com : sp.value().comments)
                {
                    val.comments().push_back(com);
                }
            }

            if(auto com_res = parse_comment_line(loc, ctx))
            {
                if(auto com_opt = com_res.unwrap())
                {
                    val.comments().push_back(com_opt.value());
                    newline_found = true; // comment includes newline at the end
                }
            }
            else
            {
                ctx.report_error(std::move(com_res.unwrap_err()));
            }

            auto ins_res = insert_value(inserting_value_kind::dotted_keys,
                    std::addressof(table.as_table()),
                    keys, std::move(key_reg), std::move(val));
            if(ins_res.is_err())
            {
                ctx.report_error(std::move(ins_res.unwrap_err()));
            }
        }
        else
        {
            ctx.report_error(std::move(kv_res.unwrap_err()));
            skip_key_value_pair(loc, ctx);
        }
    }

    if(num_errors < ctx.errors().size())
    {
        assert(ctx.has_error()); // already reported
        return err(ctx.pop_last_error());
    }
    return ok();
}